

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
TasGrid::GridLocalPolynomial::getMultiIndex<(TasGrid::RuleLocal::erule)3>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,GridLocalPolynomial *this,
          double *x)

{
  reference pvVar1;
  int iVar2;
  double extraout_XMM0_Qa;
  int local_3c;
  int local_38;
  int i;
  int j;
  allocator<int> local_22;
  undefined1 local_21;
  double *local_20;
  double *x_local;
  GridLocalPolynomial *this_local;
  vector<int,_std::allocator<int>_> *p;
  
  local_21 = 0;
  iVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
  local_20 = x;
  x_local = (double *)this;
  this_local = (GridLocalPolynomial *)__return_storage_ptr__;
  ::std::allocator<int>::allocator(&local_22);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,(long)iVar2,&local_22);
  ::std::allocator<int>::~allocator(&local_22);
  for (local_38 = 0; local_38 < (this->super_BaseCanonicalGrid).num_dimensions;
      local_38 = local_38 + 1) {
    local_3c = 0;
    while( true ) {
      iVar2 = local_3c;
      RuleLocal::getNode<(TasGrid::RuleLocal::erule)3>(local_3c);
      ::std::abs(iVar2);
      if (extraout_XMM0_Qa <= 1e-12) break;
      local_3c = local_3c + 1;
    }
    pvVar1 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,(long)local_38);
    *pvVar1 = local_3c;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> GridLocalPolynomial::getMultiIndex(const double x[]){
    std::vector<int> p(num_dimensions); // convert x to p, maybe expensive
    for(int j=0; j<num_dimensions; j++){
        int i = 0;
        while(std::abs(RuleLocal::getNode<effrule>(i) - x[j]) > Maths::num_tol) i++;
        p[j] = i;
    }
    return p;
}